

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O0

nng_err nni_pipe_getopt(nni_pipe *p,char *name,void *val,size_t *szp,nni_opt_type t)

{
  nng_err rv;
  nni_opt_type t_local;
  size_t *szp_local;
  void *val_local;
  char *name_local;
  nni_pipe *p_local;
  
  p_local._4_4_ = (*(p->p_tran_ops).p_getopt)(p->p_tran_data,name,val,szp,t);
  if (p_local._4_4_ == NNG_ENOTSUP) {
    if (p->p_dialer == (nni_dialer *)0x0) {
      if (p->p_listener == (nni_listener *)0x0) {
        p_local._4_4_ = NNG_ENOTSUP;
      }
      else {
        p_local._4_4_ = nni_listener_getopt(p->p_listener,name,val,szp,t);
      }
    }
    else {
      p_local._4_4_ = nni_dialer_getopt(p->p_dialer,name,val,szp,t);
    }
  }
  return p_local._4_4_;
}

Assistant:

nng_err
nni_pipe_getopt(
    nni_pipe *p, const char *name, void *val, size_t *szp, nni_opt_type t)
{
	nng_err rv;

	rv = p->p_tran_ops.p_getopt(p->p_tran_data, name, val, szp, t);
	if (rv != NNG_ENOTSUP) {
		return (rv);
	}

	// Maybe the endpoint knows? The guarantees on pipes ensure that the
	// pipe will not outlive its creating endpoint.
	if (p->p_dialer != NULL) {
		return (nni_dialer_getopt(p->p_dialer, name, val, szp, t));
	}
	if (p->p_listener != NULL) {
		return (nni_listener_getopt(p->p_listener, name, val, szp, t));
	}
	return (NNG_ENOTSUP);
}